

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStateQueryTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::ShaderStateQueryTests::init(ShaderStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  ApiCase *pAVar1;
  PrecisionFormatCase *pPVar2;
  GLenum in_R9D;
  
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"shader_type","SHADER_TYPE");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_01e18860;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"shader_compile_status",
                   "COMPILE_STATUS");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_01e188b8;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"shader_info_log_length",
                   "INFO_LOG_LENGTH");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_01e18910;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"shader_source_length",
                   "SHADER_SOURCE_LENGTH");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_01e18968;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"delete_status","DELETE_STATUS");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_01e189c0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"current_vertex_attrib_initial",
                   "CURRENT_VERTEX_ATTRIB");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_01e18a18;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"current_vertex_attrib_float",
                   "CURRENT_VERTEX_ATTRIB");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_01e18a70;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"current_vertex_attrib_float_to_int"
                   ,"CURRENT_VERTEX_ATTRIB");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_01e18ac8;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"program_info_log_length",
                   "INFO_LOG_LENGTH");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_01e18b20;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"program_validate_status",
                   "VALIDATE_STATUS");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_01e18b78;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"program_attached_shaders",
                   "ATTACHED_SHADERS");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_01e18bd0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"program_active_uniform_name",
                   "ACTIVE_UNIFORMS and ACTIVE_UNIFORM_MAX_LENGTH");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_01e18c28;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"program_active_uniform_types",
                   "UNIFORM_TYPE and UNIFORM_SIZE");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_01e18c80;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"active_attributes",
                   "ACTIVE_ATTRIBUTES and ACTIVE_ATTRIBUTE_MAX_LENGTH");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_01e190d0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"vertex_attrib_size",
                   "VERTEX_ATTRIB_ARRAY_SIZE");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_01e19128;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"vertex_attrib_type",
                   "VERTEX_ATTRIB_ARRAY_TYPE");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_01e19180;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"vertex_attrib_stride",
                   "VERTEX_ATTRIB_ARRAY_STRIDE");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_01e191d8;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"vertex_attrib_normalized",
                   "VERTEX_ATTRIB_ARRAY_NORMALIZED");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_01e19230;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"vertex_attrib_array_enabled",
                   "VERTEX_ATTRIB_ARRAY_ENABLED");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_01e19288;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"vertex_attrib_array_buffer_binding"
                   ,"VERTEX_ATTRIB_ARRAY_BUFFER_BINDING");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_01e192e0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"vertex_attrib_pointerv",
                   "GetVertexAttribPointerv");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_01e19338;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"uniform_value_float","GetUniform*")
  ;
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_01e19390;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"uniform_value_int","GetUniform*");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_01e193e8;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"uniform_value_boolean",
                   "GetUniform*");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_01e19440;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"uniform_value_sampler",
                   "GetUniform*");
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_01e19498;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"uniform_value_array","GetUniform*")
  ;
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_01e194f0;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pAVar1 = (ApiCase *)operator_new(0x98);
  ApiCase::ApiCase(pAVar1,(this->super_TestCaseGroup).m_context,"uniform_value_matrix","GetUniform*"
                  );
  (pAVar1->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ApiCase_01e19548;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pAVar1);
  pPVar2 = (PrecisionFormatCase *)operator_new(0xa0);
  Functional::anon_unknown_0::PrecisionFormatCase::PrecisionFormatCase
            (pPVar2,(this->super_TestCaseGroup).m_context,"precision_vertex_lowp_float",
             (char *)0x8b31,0x8df0,in_R9D);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar2);
  pPVar2 = (PrecisionFormatCase *)operator_new(0xa0);
  Functional::anon_unknown_0::PrecisionFormatCase::PrecisionFormatCase
            (pPVar2,(this->super_TestCaseGroup).m_context,"precision_vertex_mediump_float",
             (char *)0x8b31,0x8df1,in_R9D);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar2);
  pPVar2 = (PrecisionFormatCase *)operator_new(0xa0);
  Functional::anon_unknown_0::PrecisionFormatCase::PrecisionFormatCase
            (pPVar2,(this->super_TestCaseGroup).m_context,"precision_vertex_highp_float",
             (char *)0x8b31,0x8df2,in_R9D);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar2);
  pPVar2 = (PrecisionFormatCase *)operator_new(0xa0);
  Functional::anon_unknown_0::PrecisionFormatCase::PrecisionFormatCase
            (pPVar2,(this->super_TestCaseGroup).m_context,"precision_vertex_lowp_int",(char *)0x8b31
             ,0x8df3,in_R9D);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar2);
  pPVar2 = (PrecisionFormatCase *)operator_new(0xa0);
  Functional::anon_unknown_0::PrecisionFormatCase::PrecisionFormatCase
            (pPVar2,(this->super_TestCaseGroup).m_context,"precision_vertex_mediump_int",
             (char *)0x8b31,0x8df4,in_R9D);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar2);
  pPVar2 = (PrecisionFormatCase *)operator_new(0xa0);
  Functional::anon_unknown_0::PrecisionFormatCase::PrecisionFormatCase
            (pPVar2,(this->super_TestCaseGroup).m_context,"precision_vertex_highp_int",
             (char *)0x8b31,0x8df5,in_R9D);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar2);
  pPVar2 = (PrecisionFormatCase *)operator_new(0xa0);
  Functional::anon_unknown_0::PrecisionFormatCase::PrecisionFormatCase
            (pPVar2,(this->super_TestCaseGroup).m_context,"precision_fragment_lowp_float",
             (char *)0x8b30,0x8df0,in_R9D);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar2);
  pPVar2 = (PrecisionFormatCase *)operator_new(0xa0);
  Functional::anon_unknown_0::PrecisionFormatCase::PrecisionFormatCase
            (pPVar2,(this->super_TestCaseGroup).m_context,"precision_fragment_mediump_float",
             (char *)0x8b30,0x8df1,in_R9D);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar2);
  pPVar2 = (PrecisionFormatCase *)operator_new(0xa0);
  Functional::anon_unknown_0::PrecisionFormatCase::PrecisionFormatCase
            (pPVar2,(this->super_TestCaseGroup).m_context,"precision_fragment_highp_float",
             (char *)0x8b30,0x8df2,in_R9D);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar2);
  pPVar2 = (PrecisionFormatCase *)operator_new(0xa0);
  Functional::anon_unknown_0::PrecisionFormatCase::PrecisionFormatCase
            (pPVar2,(this->super_TestCaseGroup).m_context,"precision_fragment_lowp_int",
             (char *)0x8b30,0x8df3,in_R9D);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar2);
  pPVar2 = (PrecisionFormatCase *)operator_new(0xa0);
  Functional::anon_unknown_0::PrecisionFormatCase::PrecisionFormatCase
            (pPVar2,(this->super_TestCaseGroup).m_context,"precision_fragment_mediump_int",
             (char *)0x8b30,0x8df4,in_R9D);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar2);
  pPVar2 = (PrecisionFormatCase *)operator_new(0xa0);
  Functional::anon_unknown_0::PrecisionFormatCase::PrecisionFormatCase
            (pPVar2,(this->super_TestCaseGroup).m_context,"precision_fragment_highp_int",
             (char *)0x8b30,0x8df5,in_R9D);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pPVar2);
  return extraout_EAX;
}

Assistant:

void ShaderStateQueryTests::init (void)
{
	// shader
	addChild(new ShaderTypeCase						(m_context, "shader_type",							"SHADER_TYPE"));
	addChild(new ShaderCompileStatusCase			(m_context, "shader_compile_status",				"COMPILE_STATUS"));
	addChild(new ShaderInfoLogCase					(m_context, "shader_info_log_length",				"INFO_LOG_LENGTH"));
	addChild(new ShaderSourceCase					(m_context, "shader_source_length",					"SHADER_SOURCE_LENGTH"));

	// shader and program
	addChild(new DeleteStatusCase					(m_context, "delete_status",						"DELETE_STATUS"));

	// vertex-attrib
	addChild(new CurrentVertexAttribInitialCase		(m_context, "current_vertex_attrib_initial",		"CURRENT_VERTEX_ATTRIB"));
	addChild(new CurrentVertexAttribFloatCase		(m_context, "current_vertex_attrib_float",			"CURRENT_VERTEX_ATTRIB"));
	addChild(new CurrentVertexAttribConversionCase	(m_context, "current_vertex_attrib_float_to_int",	"CURRENT_VERTEX_ATTRIB"));

	// program
	addChild(new ProgramInfoLogCase					(m_context, "program_info_log_length",				"INFO_LOG_LENGTH"));
	addChild(new ProgramValidateStatusCase			(m_context, "program_validate_status",				"VALIDATE_STATUS"));
	addChild(new ProgramAttachedShadersCase			(m_context, "program_attached_shaders",				"ATTACHED_SHADERS"));

	addChild(new ProgramActiveUniformNameCase		(m_context, "program_active_uniform_name",			"ACTIVE_UNIFORMS and ACTIVE_UNIFORM_MAX_LENGTH"));
	addChild(new ProgramUniformCase					(m_context, "program_active_uniform_types",			"UNIFORM_TYPE and UNIFORM_SIZE"));

	// attribute related
	addChild(new ActiveAttributesCase				(m_context, "active_attributes",					"ACTIVE_ATTRIBUTES and ACTIVE_ATTRIBUTE_MAX_LENGTH"));
	addChild(new VertexAttributeSizeCase			(m_context, "vertex_attrib_size",					"VERTEX_ATTRIB_ARRAY_SIZE"));
	addChild(new VertexAttributeTypeCase			(m_context, "vertex_attrib_type",					"VERTEX_ATTRIB_ARRAY_TYPE"));
	addChild(new VertexAttributeStrideCase			(m_context, "vertex_attrib_stride",					"VERTEX_ATTRIB_ARRAY_STRIDE"));
	addChild(new VertexAttributeNormalizedCase		(m_context, "vertex_attrib_normalized",				"VERTEX_ATTRIB_ARRAY_NORMALIZED"));
	addChild(new VertexAttributeEnabledCase			(m_context, "vertex_attrib_array_enabled",			"VERTEX_ATTRIB_ARRAY_ENABLED"));
	addChild(new VertexAttributeBufferBindingCase	(m_context, "vertex_attrib_array_buffer_binding",	"VERTEX_ATTRIB_ARRAY_BUFFER_BINDING"));
	addChild(new VertexAttributePointerCase			(m_context, "vertex_attrib_pointerv",				"GetVertexAttribPointerv"));

	// uniform values
	addChild(new UniformValueFloatCase				(m_context, "uniform_value_float",					"GetUniform*"));
	addChild(new UniformValueIntCase				(m_context, "uniform_value_int",					"GetUniform*"));
	addChild(new UniformValueBooleanCase			(m_context, "uniform_value_boolean",				"GetUniform*"));
	addChild(new UniformValueSamplerCase			(m_context, "uniform_value_sampler",				"GetUniform*"));
	addChild(new UniformValueArrayCase				(m_context, "uniform_value_array",					"GetUniform*"));
	addChild(new UniformValueMatrixCase				(m_context, "uniform_value_matrix",					"GetUniform*"));

	// precision format query
	addChild(new PrecisionFormatCase				(m_context, "precision_vertex_lowp_float",			"GetShaderPrecisionFormat",		GL_VERTEX_SHADER,	GL_LOW_FLOAT));
	addChild(new PrecisionFormatCase				(m_context, "precision_vertex_mediump_float",		"GetShaderPrecisionFormat",		GL_VERTEX_SHADER,	GL_MEDIUM_FLOAT));
	addChild(new PrecisionFormatCase				(m_context, "precision_vertex_highp_float",			"GetShaderPrecisionFormat",		GL_VERTEX_SHADER,	GL_HIGH_FLOAT));
	addChild(new PrecisionFormatCase				(m_context, "precision_vertex_lowp_int",			"GetShaderPrecisionFormat",		GL_VERTEX_SHADER,	GL_LOW_INT));
	addChild(new PrecisionFormatCase				(m_context, "precision_vertex_mediump_int",			"GetShaderPrecisionFormat",		GL_VERTEX_SHADER,	GL_MEDIUM_INT));
	addChild(new PrecisionFormatCase				(m_context, "precision_vertex_highp_int",			"GetShaderPrecisionFormat",		GL_VERTEX_SHADER,	GL_HIGH_INT));
	addChild(new PrecisionFormatCase				(m_context, "precision_fragment_lowp_float",		"GetShaderPrecisionFormat",		GL_FRAGMENT_SHADER,	GL_LOW_FLOAT));
	addChild(new PrecisionFormatCase				(m_context, "precision_fragment_mediump_float",		"GetShaderPrecisionFormat",		GL_FRAGMENT_SHADER,	GL_MEDIUM_FLOAT));
	addChild(new PrecisionFormatCase				(m_context, "precision_fragment_highp_float",		"GetShaderPrecisionFormat",		GL_FRAGMENT_SHADER,	GL_HIGH_FLOAT));
	addChild(new PrecisionFormatCase				(m_context, "precision_fragment_lowp_int",			"GetShaderPrecisionFormat",		GL_FRAGMENT_SHADER,	GL_LOW_INT));
	addChild(new PrecisionFormatCase				(m_context, "precision_fragment_mediump_int",		"GetShaderPrecisionFormat",		GL_FRAGMENT_SHADER,	GL_MEDIUM_INT));
	addChild(new PrecisionFormatCase				(m_context, "precision_fragment_highp_int",			"GetShaderPrecisionFormat",		GL_FRAGMENT_SHADER,	GL_HIGH_INT));
}